

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

size_t __thiscall
ADynamicLight::PointerSubstitution(ADynamicLight *this,DObject *old,DObject *notOld)

{
  size_t sVar1;
  AActor *pAVar2;
  
  pAVar2 = (this->super_AActor).target.field_0.p;
  if ((pAVar2 != (AActor *)0x0) &&
     (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
    pAVar2 = (AActor *)0x0;
  }
  sVar1 = DObject::PointerSubstitution((DObject *)this,old,notOld);
  if (notOld != (DObject *)0x0) {
    (this->super_AActor).target.field_0.p = pAVar2;
  }
  return sVar1;
}

Assistant:

size_t ADynamicLight::PointerSubstitution (DObject *old, DObject *notOld)
{
	AActor *saved_target = target;
	size_t ret = Super::PointerSubstitution(old, notOld);
	if (notOld != NULL) target = saved_target;
	return ret;
}